

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::Signal_PDU::operator==(Signal_PDU *this,Signal_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Signal_PDU *Value_local;
  Signal_PDU *this_local;
  
  KVar1 = Radio_Communications_Header::operator!=
                    (&this->super_Radio_Communications_Header,
                     &Value->super_Radio_Communications_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EncodingScheme::operator!=(&this->m_EncodingScheme,&Value->m_EncodingScheme);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui32SampleRate == Value->m_ui32SampleRate) {
      if (this->m_ui16DataLength == Value->m_ui16DataLength) {
        if (this->m_ui16Samples == Value->m_ui16Samples) {
          bVar2 = std::operator!=(&this->m_vData,&Value->m_vData);
          if (bVar2) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Signal_PDU::operator == ( const Signal_PDU & Value ) const
{
    if( Radio_Communications_Header::operator !=( Value ) )               return false;
    if( m_EncodingScheme                      != Value.m_EncodingScheme ) return false;
    if( m_ui32SampleRate                      != Value.m_ui32SampleRate ) return false;
    if( m_ui16DataLength                      != Value.m_ui16DataLength ) return false;
    if( m_ui16Samples                         != Value.m_ui16Samples )    return false;
    if( m_vData                               != Value.m_vData )          return false;
    return true;
}